

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

size_t roaring_bitmap_frozen_size_in_bytes(roaring_bitmap_t *rb)

{
  uint8_t uVar1;
  int iVar2;
  sbyte sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = (rb->high_low_container).size;
  if ((long)iVar2 < 1) {
    lVar4 = 4;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    do {
      uVar1 = (rb->high_low_container).typecodes[lVar5];
      if (uVar1 == '\x01') {
        lVar6 = 0x2000;
      }
      else {
        sVar3 = 2;
        if (uVar1 != '\x03') {
          sVar3 = 1;
        }
        lVar6 = (long)*(rb->high_low_container).containers[lVar5] << sVar3;
      }
      lVar4 = lVar4 + lVar6;
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
    lVar4 = lVar4 + 4;
  }
  return iVar2 * 5 + lVar4;
}

Assistant:

size_t roaring_bitmap_frozen_size_in_bytes(const roaring_bitmap_t *rb) {
    const roaring_array_t *ra = &rb->high_low_container;
    size_t num_bytes = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                num_bytes += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                num_bytes += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                num_bytes += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }
    num_bytes += (2 + 2 + 1) * ra->size;  // keys, counts, typecodes
    num_bytes += 4;                       // header
    return num_bytes;
}